

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkPipelineDiscardRectangleStateCreateInfoEXT *info,
               DynamicStateInfo *dynamic_state_info)

{
  VkDiscardRectangleModeEXT local_3c;
  uint local_2c;
  uint32_t i;
  DynamicStateInfo *dynamic_state_info_local;
  VkPipelineDiscardRectangleStateCreateInfoEXT *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  Hasher::u32(h,info->flags);
  if ((dynamic_state_info->discard_rectangle_mode & 1U) == 0) {
    local_3c = info->discardRectangleMode;
  }
  else {
    local_3c = VK_DISCARD_RECTANGLE_MODE_INCLUSIVE_EXT;
  }
  Hasher::u32(h,local_3c);
  Hasher::u32(h,info->discardRectangleCount);
  if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
     ((dynamic_state_info->discard_rectangle & 1U) == 0)) {
    for (local_2c = 0; local_2c < info->discardRectangleCount; local_2c = local_2c + 1) {
      Hasher::s32(h,info->pDiscardRectangles[local_2c].offset.x);
      Hasher::s32(h,info->pDiscardRectangles[local_2c].offset.y);
      Hasher::u32(h,info->pDiscardRectangles[local_2c].extent.width);
      Hasher::u32(h,info->pDiscardRectangles[local_2c].extent.height);
    }
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *,
                              Hasher &h,
                              const VkPipelineDiscardRectangleStateCreateInfoEXT &info,
                              const DynamicStateInfo *dynamic_state_info)
{
	h.u32(info.flags);
	h.u32(dynamic_state_info->discard_rectangle_mode ? 0 : info.discardRectangleMode);
	h.u32(info.discardRectangleCount);
	if (dynamic_state_info && !dynamic_state_info->discard_rectangle)
	{
		for (uint32_t i = 0; i < info.discardRectangleCount; i++)
		{
			h.s32(info.pDiscardRectangles[i].offset.x);
			h.s32(info.pDiscardRectangles[i].offset.y);
			h.u32(info.pDiscardRectangles[i].extent.width);
			h.u32(info.pDiscardRectangles[i].extent.height);
		}
	}
}